

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::texcoord3f>
          (GeomPrimvar *this,double timecode,texcoord3f *dest,TimeSampleInterpolationType interp,
          string *err)

{
  bool bVar1;
  uint32_t tyid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_118;
  uint32_t local_f8;
  allocator local_f1;
  string local_f0 [32];
  string local_d0;
  undefined1 local_ac [8];
  texcoord3f value;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string *local_38;
  string *err_local;
  texcoord3f *ptStack_28;
  TimeSampleInterpolationType interp_local;
  texcoord3f *dest_local;
  double timecode_local;
  GeomPrimvar *this_local;
  
  local_38 = err;
  err_local._4_4_ = interp;
  ptStack_28 = dest;
  dest_local = (texcoord3f *)timecode;
  timecode_local = (double)this;
  if (dest == (texcoord3f *)0x0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Attribute::is_blocked(&this->_attr);
    if (bVar1) {
      if (local_38 != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)local_38,"Attribute is blocked.");
      }
      this_local._7_1_ = false;
    }
    else {
      tyid = Attribute::type_id(&this->_attr);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (bVar1) {
        memset(local_ac,0,0xc);
        bVar1 = Attribute::get_value<tinyusdz::value::texcoord3f>
                          (&this->_attr,(double)dest_local,(texcoord3f *)local_ac,err_local._4_4_);
        if (bVar1) {
          ptStack_28->s = (float)local_ac._0_4_;
          ptStack_28->t = (float)local_ac._4_4_;
          ptStack_28->r = value.s;
          this_local._7_1_ = true;
        }
        else {
          if (local_38 != (string *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_f0,
                       "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                       ,&local_f1);
            local_f8 = tinyusdz::value::TypeTraits<tinyusdz::value::texcoord3f>::type_id();
            Attribute::type_name_abi_cxx11_(&local_118,&this->_attr);
            fmt::format<double,unsigned_int,std::__cxx11::string>
                      (&local_d0,(fmt *)local_f0,(string *)&dest_local,(double *)&local_f8,
                       (uint *)&local_118,in_R9);
            std::__cxx11::string::operator+=((string *)local_38,(string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string(local_f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          }
          this_local._7_1_ = false;
        }
      }
      else {
        if (local_38 != (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_78,"Unsupported type for GeomPrimvar. type = `{}`",&local_79);
          Attribute::type_name_abi_cxx11_((string *)&value.t,&this->_attr);
          fmt::format<std::__cxx11::string>(&local_58,(fmt *)local_78,(string *)&value.t,err);
          std::__cxx11::string::operator+=((string *)local_38,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&value.t);
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}